

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_64.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  longlong *plVar42;
  __m128i *palVar43;
  __m128i *palVar44;
  __m128i *palVar45;
  __m128i *palVar46;
  __m128i *palVar47;
  __m128i *palVar48;
  int32_t iVar49;
  int iVar50;
  int iVar51;
  parasail_result_t *result_00;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *palVar52;
  long *plVar53;
  uint uVar54;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  __m128i *palVar55;
  int32_t in_R9D;
  long extraout_XMM0_Qa;
  long extraout_XMM0_Qa_00;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  long extraout_XMM0_Qa_06;
  long extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  ulong extraout_XMM0_Qa_09;
  ulong extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  long extraout_XMM0_Qb;
  long extraout_XMM0_Qb_00;
  long lVar59;
  long lVar60;
  ulong uVar61;
  ulong uVar62;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  long extraout_XMM0_Qb_06;
  long extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  ulong extraout_XMM0_Qb_09;
  ulong extraout_XMM0_Qb_10;
  undefined8 extraout_XMM0_Qb_11;
  ulong extraout_XMM0_Qb_12;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  __m128i alVar66;
  __m128i alVar67;
  __m128i alVar68;
  __m128i alVar69;
  __m128i c;
  __m128i c_00;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i vH_04;
  __m128i vH_05;
  __m128i vH_06;
  __m128i vH_07;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i a_18;
  __m128i a_19;
  __m128i a_20;
  __m128i alVar70;
  __m128i alVar71;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i b_17;
  __m128i b_18;
  __m128i b_19;
  __m128i b_20;
  __m128i b_21;
  __m128i b_22;
  __m128i b_23;
  int32_t in_stack_fffffffffffff178;
  int32_t temp;
  int32_t column_len;
  int64_t *l;
  int64_t *s;
  int64_t *m;
  int64_t *t;
  __m128i *tmp_15;
  __m128i *tmp_14;
  __m128i *tmp_13;
  __m128i *tmp_12;
  __m128i *tmp_11;
  __m128i *tmp_10;
  __m128i *tmp_9;
  __m128i *tmp_8;
  __m128i vCompare;
  __m128i cond;
  __m128i case2_1;
  __m128i case1_1;
  __m128i vHp;
  __m128i case2;
  __m128i case1;
  __m128i cond_zero;
  __m128i *tmp_7;
  __m128i *tmp_6;
  __m128i *tmp_5;
  __m128i *tmp_4;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *tmp_1;
  __m128i *tmp;
  __m128i *vPS;
  __m128i *vPM;
  __m128i *vP;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  parasail_result_t *result;
  int64_t maxp;
  __m128i vPosLimit;
  __m128i vSaturationCheckMax;
  __m128i vMaxHUnit;
  __m128i vMaxH;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  __m128i vOne;
  __m128i vZero;
  __m128i vGapE;
  __m128i vGapO;
  longlong *local_b50;
  __m128i *pvHLMax;
  __m128i *pvHSMax;
  __m128i *pvHMMax;
  __m128i *pvHMax;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvHLLoad;
  __m128i *pvHLStore;
  __m128i *pvHSLoad;
  __m128i *pvHSStore;
  __m128i *pvHMLoad;
  __m128i *pvHMStore;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfileS;
  __m128i *vProfileM;
  __m128i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  uint local_aa0;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  size_t len;
  longlong extraout_RDX_07;
  longlong extraout_RDX_08;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_striped_profile_sse41_128_64",
            "profile");
    return (parasail_result_t *)0x0;
  }
  if ((profile->profile64).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_striped_profile_sse41_128_64",
            "profile->profile64.score");
    return (parasail_result_t *)0x0;
  }
  if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_striped_profile_sse41_128_64",
            "profile->matrix");
    return (parasail_result_t *)0x0;
  }
  if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_striped_profile_sse41_128_64",
            "profile->s1Len");
    return (parasail_result_t *)0x0;
  }
  if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_striped_profile_sse41_128_64","s2");
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_striped_profile_sse41_128_64",
            "s2Len");
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_striped_profile_sse41_128_64",
            "open");
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_striped_profile_sse41_128_64",
            "gap");
    return (parasail_result_t *)0x0;
  }
  local_aa0 = 0;
  s1Len = profile->s1Len;
  ppVar3 = profile->matrix;
  iVar50 = (s1Len + 1) / 2;
  pvVar4 = (profile->profile64).matches;
  pvVar5 = (profile->profile64).similar;
  matches = -0x4000000000000000;
  similar = 0;
  length = 0;
  vMaxH[1] = 0;
  vPosLimit[1] = 0;
  vSaturationCheckMax[0] = 0;
  iVar51 = ppVar3->max;
  result_00 = parasail_result_new_table3(iVar50 * 2,s2Len);
  if (result_00 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  result_00->flag = result_00->flag | 0x2810804;
  uVar54 = result_00->flag | 0x20000;
  len = (size_t)uVar54;
  result_00->flag = uVar54;
  pvHLoad = parasail_memalign___m128i(0x10,(long)iVar50);
  pvHMStore = parasail_memalign___m128i(0x10,(long)iVar50);
  pvHMLoad = parasail_memalign___m128i(0x10,(long)iVar50);
  pvHSStore = parasail_memalign___m128i(0x10,(long)iVar50);
  pvHSLoad = parasail_memalign___m128i(0x10,(long)iVar50);
  pvHLStore = parasail_memalign___m128i(0x10,(long)iVar50);
  pvHLLoad = parasail_memalign___m128i(0x10,(long)iVar50);
  pvE = parasail_memalign___m128i(0x10,(long)iVar50);
  b = parasail_memalign___m128i(0x10,(long)iVar50);
  b_00 = parasail_memalign___m128i(0x10,(long)iVar50);
  b_01 = parasail_memalign___m128i(0x10,(long)iVar50);
  b_02 = parasail_memalign___m128i(0x10,(long)iVar50);
  pvHMMax = parasail_memalign___m128i(0x10,(long)iVar50);
  pvHSMax = parasail_memalign___m128i(0x10,(long)iVar50);
  pvHLMax = parasail_memalign___m128i(0x10,(long)iVar50);
  local_b50 = *parasail_memalign___m128i(0x10,(long)iVar50);
  if (pvHLoad == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (pvHMStore == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (pvHMLoad == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (pvHSStore == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (pvHSLoad == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (pvHLStore == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (pvHLLoad == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (pvE == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (b == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (b_00 == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (b_01 == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (b_02 == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (pvHMMax == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (pvHSMax == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (pvHLMax == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if ((__m128i *)local_b50 == (__m128i *)0x0) {
    return (parasail_result_t *)0x0;
  }
  alVar71[0] = (long)iVar50;
  alVar71[1] = extraout_RDX;
  parasail_memset___m128i(pvHLoad,alVar71,len);
  alVar66[0] = (long)iVar50;
  alVar66[1] = extraout_RDX_00;
  parasail_memset___m128i(pvHMLoad,alVar66,len);
  alVar67[0] = (long)iVar50;
  alVar67[1] = extraout_RDX_01;
  parasail_memset___m128i(pvHSLoad,alVar67,len);
  alVar68[0] = (long)iVar50;
  alVar68[1] = extraout_RDX_02;
  parasail_memset___m128i(pvHLLoad,alVar68,len);
  alVar69[0] = (long)iVar50;
  alVar69[1] = extraout_RDX_03;
  parasail_memset___m128i(b,alVar69,len);
  alVar70[0] = (long)iVar50;
  alVar70[1] = extraout_RDX_04;
  parasail_memset___m128i(b_00,alVar70,len);
  c[0] = (long)iVar50;
  c[1] = extraout_RDX_05;
  parasail_memset___m128i(b_01,c,len);
  c_00[0] = (long)iVar50;
  c_00[1] = extraout_RDX_06;
  palVar55 = b_02;
  parasail_memset___m128i(b_02,c_00,len);
  for (end_query = 0; palVar48 = pvHLoad, palVar47 = pvHMLoad, palVar46 = pvHSLoad,
      palVar45 = pvHLLoad, palVar44 = pvHMMax, palVar43 = pvHSMax, palVar52 = pvHLMax,
      plVar42 = local_b50, end_query < s2Len; end_query = end_query + 1) {
    vF_ext[1] = 0;
    vF[0] = 0;
    stack0xfffffffffffff368 = ZEXT816(0);
    stack0xfffffffffffff358 = ZEXT816(0);
    vFL[0] = 1;
    vH[1] = 1;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = pvHMLoad[iVar50 + -1][0];
    stack0xfffffffffffff318 = (__m128i)(auVar65 << 0x40);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = pvHSLoad[iVar50 + -1][0];
    stack0xfffffffffffff308 = (__m128i)(auVar63 << 0x40);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = pvHLLoad[iVar50 + -1][0];
    _vP = (__m128i)(auVar64 << 0x40);
    iVar1 = ppVar3->mapper[(byte)s2[end_query]];
    vH_07[0] = (ulong)end_query;
    b_22[0] = (ulong)(byte)s2[vH_07[0]];
    iVar2 = ppVar3->mapper[b_22[0]];
    uVar56 = (ulong)(end_query - 2U);
    if (local_aa0 == end_query - 2U) {
      pvHMMax = pvHMStore;
      pvHLoad = palVar44;
      pvHSMax = pvHSStore;
      pvHMLoad = palVar43;
      pvHLMax = pvHLStore;
      pvHSLoad = palVar52;
      local_b50 = *pvE;
      pvHLLoad = (__m128i *)plVar42;
    }
    else {
      pvHLoad = pvHMStore;
      pvHMLoad = pvHSStore;
      pvHSLoad = pvHLStore;
      pvHLLoad = pvE;
    }
    pvHMStore = palVar48;
    pvHSStore = palVar47;
    pvHLStore = palVar46;
    pvE = palVar45;
    for (k = 0; k < iVar50; k = k + 1) {
      alVar68 = b_00[k];
      alVar71 = b_00[k];
      alVar69 = b_01[k];
      alVar66 = b_01[k];
      palVar52 = b_02 + k;
      b_12[1] = (*palVar52)[0];
      b_16[1] = (*palVar52)[1];
      alVar67 = *palVar52;
      b_03[1] = (long)k * 0x10;
      a[1] = vH_07[0];
      a[0] = (longlong)palVar55;
      b_03[0] = b_22[0];
      alVar70 = _mm_max_epi64_rpl(a,b_03);
      b_04[0] = alVar70[1];
      a_00[1] = vH_07[0];
      a_00[0] = (longlong)palVar55;
      b_04[1] = b_03[1];
      alVar70 = _mm_max_epi64_rpl(a_00,b_04);
      b_05[0] = alVar70[1];
      a_01[1] = vH_07[0];
      a_01[0] = (longlong)palVar55;
      b_05[1] = b_03[1];
      alVar70 = _mm_max_epi64_rpl(a_01,b_05);
      b_06[0] = alVar70[1];
      pvHLoad[k][0] = extraout_XMM0_Qa_00;
      pvHLoad[k][1] = extraout_XMM0_Qb_00;
      uVar56 = -(ulong)(extraout_XMM0_Qa_00 == 0);
      b_22[0] = -(ulong)(extraout_XMM0_Qb_00 == 0);
      b_03[1] = -(ulong)(extraout_XMM0_Qa_00 == extraout_XMM0_Qa);
      lVar59 = -(ulong)(extraout_XMM0_Qb_00 == extraout_XMM0_Qb);
      b_06[1] = -(ulong)(extraout_XMM0_Qa_00 == vF_ext[1]);
      lVar60 = -(ulong)(extraout_XMM0_Qb_00 == vF[0]);
      auVar36._8_8_ = lVar60;
      auVar36._0_8_ = b_06[1];
      auVar65 = pblendvb((undefined1  [16])alVar71,stack0xfffffffffffff368,auVar36);
      plVar53 = (long *)((long)pvVar4 + (long)k * 0x10 + (long)(iVar1 * iVar50) * 0x10);
      auVar35._8_8_ = vHM[0] + plVar53[1];
      auVar35._0_8_ = vHS[1] + *plVar53;
      auVar34._8_8_ = lVar59;
      auVar34._0_8_ = b_03[1];
      auVar65 = pblendvb(auVar65,auVar35,auVar34);
      vHS[1] = auVar65._0_8_;
      vHM[0] = auVar65._8_8_;
      uVar57 = ~uVar56 & vHS[1];
      uVar61 = ~b_22[0] & vHM[0];
      pvHMLoad[k][0] = uVar57;
      pvHMLoad[k][1] = uVar61;
      auVar33._8_8_ = lVar60;
      auVar33._0_8_ = b_06[1];
      auVar65 = pblendvb((undefined1  [16])alVar66,stack0xfffffffffffff358,auVar33);
      plVar53 = (long *)((long)pvVar5 + (long)k * 0x10 + (long)(iVar2 * iVar50) * 0x10);
      auVar32._8_8_ = vHS[0] + plVar53[1];
      auVar32._0_8_ = vHL[1] + *plVar53;
      auVar31._8_8_ = lVar59;
      auVar31._0_8_ = b_03[1];
      auVar65 = pblendvb(auVar65,auVar32,auVar31);
      vHL[1] = auVar65._0_8_;
      vHS[0] = auVar65._8_8_;
      uVar58 = ~uVar56 & vHL[1];
      uVar62 = ~b_22[0] & vHS[0];
      pvHSLoad[k][0] = uVar58;
      pvHSLoad[k][1] = uVar62;
      auVar30._8_8_ = lVar60;
      auVar30._0_8_ = b_06[1];
      auVar65 = pblendvb((undefined1  [16])alVar67,stack0xfffffffffffff348,auVar30);
      auVar29._8_8_ = vHL[0] + 1;
      auVar29._0_8_ = (undefined1 *)((long)*vP + 1);
      auVar28._8_8_ = lVar59;
      auVar28._0_8_ = b_03[1];
      auVar65 = pblendvb(auVar65,auVar29,auVar28);
      local_238 = auVar65._0_4_;
      uStack_234 = auVar65._4_4_;
      uStack_230 = auVar65._8_4_;
      uStack_22c = auVar65._12_4_;
      vP = (__m128i *)
           CONCAT44((uint)((uVar56 ^ 0xffffffffffffffff) >> 0x20) & uStack_234,
                    (uint)(uVar56 ^ 0xffffffffffffffff) & local_238);
      palVar52 = vP;
      vHL[0]._0_4_ = (uint)(b_22[0] ^ 0xffffffffffffffff) & uStack_230;
      vHL[0]._4_4_ = (uint)((b_22[0] ^ 0xffffffffffffffff) >> 0x20) & uStack_22c;
      b_06[1] = (long)k * 0x10;
      pvHLLoad[k][0] = (longlong)palVar52;
      pvHLLoad[k][1] = vHL[0];
      a_02[1] = vH_07[0];
      a_02[0] = (longlong)palVar55;
      alVar71 = _mm_max_epi64_rpl(a_02,b_06);
      b_07[0] = alVar71[1];
      a_03[1] = vH_07[0];
      a_03[0] = (longlong)palVar55;
      b_07[1] = b_06[1];
      alVar71 = _mm_max_epi64_rpl(a_03,b_07);
      b_08[0] = alVar71[1];
      a_04[1] = vH_07[0];
      a_04[0] = (longlong)palVar55;
      b_08[1] = b_06[1];
      _mm_max_epi64_rpl(a_04,b_08);
      vH_00[0] = (ulong)(uint)k;
      vH_00[1]._0_4_ = iVar50;
      vH_00[1]._4_4_ = 0;
      arr_store(*(int **)((long)((result_00->field_4).trace)->trace_del_table + 8),vH_00,end_query,
                s2Len,in_R9D,in_stack_fffffffffffff178);
      vH_01[0] = (ulong)(uint)k;
      vH_01[1]._0_4_ = iVar50;
      vH_01[1]._4_4_ = 0;
      arr_store(*(int **)((long)((result_00->field_4).trace)->trace_del_table + 0x10),vH_01,
                end_query,s2Len,in_R9D,in_stack_fffffffffffff178);
      vH_02[0] = (ulong)(uint)k;
      vH_02[1]._0_4_ = iVar50;
      vH_02[1]._4_4_ = 0;
      arr_store(*(int **)((long)((result_00->field_4).trace)->trace_del_table + 0x18),vH_02,
                end_query,s2Len,in_R9D,in_stack_fffffffffffff178);
      palVar55 = *((result_00->field_4).trace)->trace_del_table;
      vH_03[0] = (ulong)(uint)k;
      vH_07[0] = (ulong)(uint)end_query;
      vH_03[1]._0_4_ = iVar50;
      vH_03[1]._4_4_ = 0;
      arr_store((int *)palVar55,vH_03,end_query,s2Len,in_R9D,in_stack_fffffffffffff178);
      a_05[1] = vH_03[0];
      a_05[0] = (longlong)palVar55;
      b_09[1] = vH_07[0];
      b_09[0] = extraout_RDX_07;
      alVar71 = _mm_max_epi64_rpl(a_05,b_09);
      b_10[0] = alVar71[1];
      a_06[1] = vH_03[0];
      a_06[0] = (longlong)palVar55;
      b_10[1] = vH_07[0];
      alVar71 = _mm_max_epi64_rpl(a_06,b_10);
      b_11[0] = alVar71[1];
      a_07[1] = vH_03[0];
      a_07[0] = (longlong)palVar55;
      b_11[1] = vH_07[0];
      alVar71 = _mm_cmpgt_epi64_rpl(a_07,b_11);
      b_12[0] = alVar71[1];
      auVar27._8_8_ = uVar61;
      auVar27._0_8_ = uVar57;
      auVar26._8_8_ = extraout_XMM0_Qb_03;
      auVar26._0_8_ = extraout_XMM0_Qa_03;
      auVar65 = pblendvb((undefined1  [16])alVar68,auVar27,auVar26);
      auVar25._8_8_ = uVar62;
      auVar25._0_8_ = uVar58;
      auVar24._8_8_ = extraout_XMM0_Qb_03;
      auVar24._0_8_ = extraout_XMM0_Qa_03;
      auVar63 = pblendvb((undefined1  [16])alVar69,auVar25,auVar24);
      auVar23._8_8_ = b_16[1] + 1;
      auVar23._0_8_ = b_12[1] + 1;
      auVar22._8_8_ = vHL[0] + 1;
      auVar22._0_8_ = (undefined1 *)((long)*palVar52 + 1);
      auVar21._8_8_ = extraout_XMM0_Qb_03;
      auVar21._0_8_ = extraout_XMM0_Qa_03;
      auVar64 = pblendvb(auVar23,auVar22,auVar21);
      b[k][0] = extraout_XMM0_Qa_02;
      b[k][1] = extraout_XMM0_Qb_02;
      vES[1] = auVar65._0_8_;
      vEM[0] = auVar65._8_8_;
      b_00[k][0] = vES[1];
      b_00[k][1] = vEM[0];
      vEL[1] = auVar63._0_8_;
      vES[0] = auVar63._8_8_;
      b_01[k][0] = vEL[1];
      b_01[k][1] = vES[0];
      b_12[1] = (long)k * 0x10;
      vF[1] = auVar64._0_8_;
      vEL[0] = auVar64._8_8_;
      b_02[k][0] = vF[1];
      b_02[k][1] = vEL[0];
      a_08[1] = vH_03[0];
      a_08[0] = (longlong)palVar55;
      alVar71 = _mm_max_epi64_rpl(a_08,b_12);
      b_13[0] = alVar71[1];
      a_09[1] = vH_03[0];
      a_09[0] = (longlong)palVar55;
      b_13[1] = b_12[1];
      alVar71 = _mm_cmpgt_epi64_rpl(a_09,b_13);
      b_22[0] = alVar71[1];
      auVar20._8_8_ = uVar61;
      auVar20._0_8_ = uVar57;
      auVar19._8_8_ = extraout_XMM0_Qb_05;
      auVar19._0_8_ = extraout_XMM0_Qa_05;
      register0x00001240 = pblendvb(stack0xfffffffffffff368,auVar20,auVar19);
      auVar18._8_8_ = uVar62;
      auVar18._0_8_ = uVar58;
      auVar17._8_8_ = extraout_XMM0_Qb_05;
      auVar17._0_8_ = extraout_XMM0_Qa_05;
      register0x00001240 = pblendvb(stack0xfffffffffffff358,auVar18,auVar17);
      auVar16._8_8_ = vFL[0] + 1;
      auVar16._0_8_ = vH[1] + 1;
      auVar15._8_8_ = vHL[0] + 1;
      auVar15._0_8_ = (undefined1 *)((long)*palVar52 + 1);
      auVar14._8_8_ = extraout_XMM0_Qb_05;
      auVar14._0_8_ = extraout_XMM0_Qa_05;
      register0x00001240 = pblendvb(auVar16,auVar15,auVar14);
      unique0x100031f5 = palVar47[k];
      unique0x10003205 = palVar46[k];
      uVar56 = (long)k * 0x10;
      _vP = palVar45[k];
      vH_07[0] = vH_03[0];
      vF_ext[1] = extraout_XMM0_Qa_04;
      vF[0] = extraout_XMM0_Qb_04;
      vPosLimit[1] = extraout_XMM0_Qa_01;
      vSaturationCheckMax[0] = extraout_XMM0_Qb_01;
    }
    for (end_ref = 0; end_ref < 2; end_ref = end_ref + 1) {
      vF[0] = vF_ext[1];
      vF_ext[1] = (longlong)-open;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = vFS[1];
      stack0xfffffffffffff368 = auVar40 << 0x40;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = vFL[1];
      stack0xfffffffffffff358 = auVar41 << 0x40;
      vFL[0] = vH[1];
      vH[1] = 1;
      k = 0;
      iVar49 = k;
      iVar1 = iVar50 + -1;
      while (k = iVar49, uVar56 = (long)iVar1 * 0x10, k < iVar50) {
        b_14[1] = (long)k * 0x10;
        a_10[1] = vH_07[0];
        a_10[0] = (longlong)palVar55;
        b_14[0] = b_22[0];
        alVar71 = _mm_max_epi64_rpl(a_10,b_14);
        b_15[0] = alVar71[1];
        b_15[1] = (long)k * 0x10;
        a_11[1] = vH_07[0];
        a_11[0] = (longlong)palVar55;
        alVar71 = _mm_max_epi64_rpl(a_11,b_15);
        b_16[0] = alVar71[1];
        pvHLoad[k][0] = extraout_XMM0_Qa_07;
        pvHLoad[k][1] = extraout_XMM0_Qb_07;
        uVar56 = ~-(ulong)(extraout_XMM0_Qa_07 == extraout_XMM0_Qa_06) &
                 -(ulong)(extraout_XMM0_Qa_07 == vF_ext[1]);
        b_22[0] = ~-(ulong)(extraout_XMM0_Qb_07 == extraout_XMM0_Qb_06) &
                  -(ulong)(extraout_XMM0_Qb_07 == vF[0]);
        auVar13._8_8_ = b_22[0];
        auVar13._0_8_ = uVar56;
        auVar65 = pblendvb((undefined1  [16])pvHMLoad[k],stack0xfffffffffffff368,auVar13);
        vHS[1] = auVar65._0_8_;
        vHM[0] = auVar65._8_8_;
        pvHMLoad[k][0] = vHS[1];
        pvHMLoad[k][1] = vHM[0];
        auVar12._8_8_ = b_22[0];
        auVar12._0_8_ = uVar56;
        auVar63 = pblendvb((undefined1  [16])pvHSLoad[k],stack0xfffffffffffff358,auVar12);
        vHL[1] = auVar63._0_8_;
        vHS[0] = auVar63._8_8_;
        pvHSLoad[k][0] = vHL[1];
        pvHSLoad[k][1] = vHS[0];
        auVar11._8_8_ = b_22[0];
        auVar11._0_8_ = uVar56;
        auVar64 = pblendvb((undefined1  [16])pvHLLoad[k],stack0xfffffffffffff348,auVar11);
        b_16[1] = (long)k * 0x10;
        vP = auVar64._0_8_;
        vHL[0] = auVar64._8_8_;
        pvHLLoad[k][0] = (longlong)vP;
        pvHLLoad[k][1] = vHL[0];
        a_12[1] = vH_07[0];
        a_12[0] = (longlong)palVar55;
        alVar71 = _mm_max_epi64_rpl(a_12,b_16);
        b_17[0] = alVar71[1];
        a_13[1] = vH_07[0];
        a_13[0] = (longlong)palVar55;
        b_17[1] = b_16[1];
        alVar71 = _mm_max_epi64_rpl(a_13,b_17);
        b_18[0] = alVar71[1];
        a_14[1] = vH_07[0];
        a_14[0] = (longlong)palVar55;
        b_18[1] = b_16[1];
        _mm_max_epi64_rpl(a_14,b_18);
        vH_04[0] = (ulong)(uint)k;
        vH_04[1]._0_4_ = iVar50;
        vH_04[1]._4_4_ = 0;
        arr_store(*(int **)((long)((result_00->field_4).trace)->trace_del_table + 8),vH_04,end_query
                  ,s2Len,in_R9D,in_stack_fffffffffffff178);
        vH_05[0] = (ulong)(uint)k;
        vH_05[1]._0_4_ = iVar50;
        vH_05[1]._4_4_ = 0;
        arr_store(*(int **)((long)((result_00->field_4).trace)->trace_del_table + 0x10),vH_05,
                  end_query,s2Len,in_R9D,in_stack_fffffffffffff178);
        vH_06[0] = (ulong)(uint)k;
        vH_06[1]._0_4_ = iVar50;
        vH_06[1]._4_4_ = 0;
        arr_store(*(int **)((long)((result_00->field_4).trace)->trace_del_table + 0x18),vH_06,
                  end_query,s2Len,in_R9D,in_stack_fffffffffffff178);
        palVar55 = *((result_00->field_4).trace)->trace_del_table;
        vH_07[0] = (ulong)(uint)k;
        uVar56 = (ulong)(uint)end_query;
        vH_07[1]._0_4_ = iVar50;
        vH_07[1]._4_4_ = 0;
        arr_store((int *)palVar55,vH_07,end_query,s2Len,in_R9D,in_stack_fffffffffffff178);
        a_15[1] = vH_07[0];
        a_15[0] = (longlong)palVar55;
        b_19[1] = uVar56;
        b_19[0] = extraout_RDX_08;
        alVar71 = _mm_max_epi64_rpl(a_15,b_19);
        b_20[0] = alVar71[1];
        vF_ext[1] = vF_ext[1] - gap;
        vF[0] = vF[0] - gap;
        a_16[1] = vH_07[0];
        a_16[0] = (longlong)palVar55;
        b_20[1] = uVar56;
        alVar71 = _mm_cmpgt_epi64_rpl(a_16,b_20);
        b_21[0] = alVar71[1];
        a_17[1] = vH_07[0];
        a_17[0] = (longlong)palVar55;
        b_21[1] = uVar56;
        alVar71 = _mm_cmpgt_epi64_rpl(a_17,b_21);
        b_22[0] = alVar71[1];
        vH_03[0] = extraout_XMM0_Qb_09 |
                   -(ulong)(vF[0] == extraout_XMM0_Qb_07 - open) & extraout_XMM0_Qb_10;
        auVar39._8_8_ = vH_03[0];
        auVar39._0_8_ =
             extraout_XMM0_Qa_09 |
             -(ulong)(vF_ext[1] == extraout_XMM0_Qa_07 - open) & extraout_XMM0_Qa_10;
        vPosLimit[1] = extraout_XMM0_Qa_08;
        vSaturationCheckMax[0] = extraout_XMM0_Qb_08;
        if ((((((((((((((((auVar39 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar39 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar39 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar39 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar39 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar39 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (vH_03[0] >> 7 & 1) == 0) && (vH_03[0] >> 0xf & 1) == 0) &&
                (vH_03[0] >> 0x17 & 1) == 0) && (vH_03[0] >> 0x1f & 1) == 0) &&
              (vH_03[0] >> 0x27 & 1) == 0) && (vH_03[0] >> 0x2f & 1) == 0) &&
            (vH_03[0] >> 0x37 & 1) == 0) && -1 < (long)vH_03[0]) goto LAB_00a0be5b;
        a_18[1] = vH_07[0];
        a_18[0] = (longlong)palVar55;
        b_22[1] = uVar56;
        alVar71 = _mm_cmpgt_epi64_rpl(a_18,b_22);
        b_22[0] = alVar71[1];
        auVar10._8_8_ = extraout_XMM0_Qb_11;
        auVar10._0_8_ = extraout_XMM0_Qa_11;
        register0x00001240 = pblendvb(stack0xfffffffffffff368,auVar65,auVar10);
        auVar9._8_8_ = extraout_XMM0_Qb_11;
        auVar9._0_8_ = extraout_XMM0_Qa_11;
        register0x00001240 = pblendvb(stack0xfffffffffffff358,auVar63,auVar9);
        auVar8._8_8_ = vFL[0] + 1;
        auVar8._0_8_ = vH[1] + 1;
        auVar7._8_8_ = vHL[0] + 1;
        auVar7._0_8_ = (undefined1 *)((long)*vP + 1);
        auVar6._8_8_ = extraout_XMM0_Qb_11;
        auVar6._0_8_ = extraout_XMM0_Qa_11;
        register0x00001240 = pblendvb(auVar8,auVar7,auVar6);
        iVar1 = k;
        iVar49 = k + 1;
      }
    }
LAB_00a0be5b:
    a_19[1] = vH_07[0];
    a_19[0] = (longlong)palVar55;
    b_23[1] = uVar56;
    b_23[0] = b_22[0];
    _mm_cmpgt_epi64_rpl(a_19,b_23);
    auVar38._8_8_ = extraout_XMM0_Qb_12;
    auVar38._0_8_ = extraout_XMM0_Qa_12;
    if ((((((((((((((((auVar38 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar38 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar38 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar38 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar38 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar38 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (extraout_XMM0_Qb_12 >> 7 & 1) != 0) || (extraout_XMM0_Qb_12 >> 0xf & 1) != 0) ||
            (extraout_XMM0_Qb_12 >> 0x17 & 1) != 0) || (extraout_XMM0_Qb_12 >> 0x1f & 1) != 0) ||
          (extraout_XMM0_Qb_12 >> 0x27 & 1) != 0) || (extraout_XMM0_Qb_12 >> 0x2f & 1) != 0) ||
        (extraout_XMM0_Qb_12 >> 0x37 & 1) != 0) || (long)extraout_XMM0_Qb_12 < 0) {
      a_20[1] = vH_07[0];
      a_20[0] = (longlong)palVar55;
      matches = _mm_hmax_epi64_rpl(a_20);
      if (0x7fffffffffffffff - (long)(iVar51 + 1) < matches) {
        result_00->flag = result_00->flag | 0x40;
        break;
      }
      local_aa0 = end_query;
    }
  }
  palVar43 = pvHMMax;
  palVar52 = pvHSMax;
  palVar55 = pvHLMax;
  plVar42 = local_b50;
  if (matches != 0x7fffffffffffffff) {
    vH_07[0] = -(ulong)(vSaturationCheckMax[0] == 0x7fffffffffffffff);
    auVar37._8_8_ = vH_07[0];
    auVar37._0_8_ = -(ulong)(vPosLimit[1] == 0x7fffffffffffffff);
    if ((((((((((((((((auVar37 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar37 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar37 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar37 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar37 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar37 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (vH_07[0] >> 7 & 1) == 0) && (vH_07[0] >> 0xf & 1) == 0) &&
            (vH_07[0] >> 0x17 & 1) == 0) && (vH_07[0] >> 0x1f & 1) == 0) &&
          (vH_07[0] >> 0x27 & 1) == 0) && (vH_07[0] >> 0x2f & 1) == 0) &&
        (vH_07[0] >> 0x37 & 1) == 0) && vSaturationCheckMax[0] != 0x7fffffffffffffff)
    goto LAB_00a0bf99;
  }
  result_00->flag = result_00->flag | 0x40;
LAB_00a0bf99:
  iVar51 = parasail_result_is_saturated(result_00);
  if (iVar51 == 0) {
    if (local_aa0 == end_query - 1U) {
      pvHMMax = pvHLoad;
      pvHLoad = palVar43;
      pvHSMax = pvHMLoad;
      pvHMLoad = palVar52;
      pvHLMax = pvHSLoad;
      pvHSLoad = palVar55;
      local_b50 = *pvHLLoad;
      pvHLLoad = (__m128i *)plVar42;
    }
    else if (local_aa0 == end_query - 2U) {
      pvHMMax = pvHMStore;
      pvHMStore = palVar43;
      pvHSMax = pvHSStore;
      pvHSStore = palVar52;
      pvHLMax = pvHLStore;
      pvHLStore = palVar55;
      local_b50 = *pvE;
      pvE = (__m128i *)plVar42;
    }
    m = *pvHMMax;
    s = *pvHSMax;
    l = *pvHLMax;
    _temp = local_b50;
    k = 0;
    while( true ) {
      if (iVar50 * 2 <= k) break;
      if ((*m == matches) && (iVar51 = k / 2 + (k % 2) * iVar50, iVar51 < s1Len)) {
        similar = *s;
        length = *l;
        vMaxH[1] = *_temp;
        s1Len = iVar51;
      }
      k = k + 1;
      m = m + 1;
      s = s + 1;
      l = l + 1;
      _temp = _temp + 1;
    }
  }
  else {
    matches = 0;
    s1Len = 0;
    local_aa0 = 0;
    similar._0_4_ = 0;
    length._0_4_ = 0;
    vMaxH[1]._0_4_ = 0;
  }
  result_00->score = (int)matches;
  result_00->end_query = s1Len;
  result_00->end_ref = local_aa0;
  ((result_00->field_4).stats)->matches = (int)similar;
  ((result_00->field_4).stats)->similar = (int)length;
  ((result_00->field_4).stats)->length = (int)vMaxH[1];
  parasail_free(local_b50);
  parasail_free(pvHLMax);
  parasail_free(pvHSMax);
  parasail_free(pvHMMax);
  parasail_free(b_02);
  parasail_free(b_01);
  parasail_free(b_00);
  parasail_free(b);
  parasail_free(pvE);
  parasail_free(pvHLLoad);
  parasail_free(pvHLStore);
  parasail_free(pvHSLoad);
  parasail_free(pvHSStore);
  parasail_free(pvHMLoad);
  parasail_free(pvHMStore);
  parasail_free(pvHLoad);
  return result_00;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vSaturationCheckMax;
    __m128i vPosLimit;
    int64_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_INF;
    matches = NEG_INF;
    similar = NEG_INF;
    length = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    vSaturationCheckMax = vZero;
    vPosLimit = _mm_set1_epi64x_rpl(INT64_MAX);
    maxp = INT64_MAX - (int64_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    pvHMax    = parasail_memalign___m128i(16, segLen);
    pvHMMax   = parasail_memalign___m128i(16, segLen);
    pvHSMax   = parasail_memalign___m128i(16, segLen);
    pvHLMax   = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i cond_zero;
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi64_rpl(vH_dag, vZero);
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            cond_zero = _mm_cmpeq_epi64(vH, vZero);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)), case1);
            vHM = _mm_andnot_si128(cond_zero, vHM);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)), case1);
            vHS = _mm_andnot_si128(cond_zero, vHS);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne), case1);
            vHL = _mm_andnot_si128(cond_zero, vHL);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, -open, 0);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vHp = _mm_max_epi64_rpl(vHp, vZero);
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_and_si128(
                                    _mm_cmpeq_epi64(vF_ext, vEF_opn),
                                    _mm_cmpgt_epi64_rpl(vF_ext, vZero)))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (score == INT64_MAX
            || _mm_movemask_epi8(_mm_cmpeq_epi64(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int64_t *m = (int64_t*)pvHMMax;
            int64_t *s = (int64_t*)pvHSMax;
            int64_t *l = (int64_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}